

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O1

void Extra_ThreshPrintWeights(int T,int *pW,int nVars)

{
  ulong uVar1;
  
  if (T != 0) {
    fwrite("\nHeuristic method: Weights and threshold value:\n",0x30,1,_stdout);
    if (0 < nVars) {
      uVar1 = 0;
      do {
        printf("%d ",(ulong)(uint)pW[uVar1]);
        uVar1 = uVar1 + 1;
      } while ((uint)nVars != uVar1);
    }
    printf("  %d\n",T);
    return;
  }
  fwrite("\nHeuristic method: is not TLF\n\n",0x1f,1,_stdout);
  return;
}

Assistant:

void Extra_ThreshPrintWeights(int T, int * pW, int nVars) {
	int i;

	if (T == 0)
		fprintf( stdout, "\nHeuristic method: is not TLF\n\n");
	else {
		fprintf( stdout, "\nHeuristic method: Weights and threshold value:\n");
		for (i = 0; i < nVars; i++)
			printf("%d ", pW[i]);
		printf("  %d\n", T);
	}
}